

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall TeamChangeIRCCommand::create(TeamChangeIRCCommand *this)

{
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  size_t local_60;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  size_t local_30;
  char *local_28;
  size_t local_20;
  char *local_18;
  TeamChangeIRCCommand *this_local;
  
  bVar1 = sv("team",4);
  local_20 = bVar1._M_len;
  local_18 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_20,local_18);
  bVar1 = sv("tc",2);
  local_30 = bVar1._M_len;
  local_28 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_30,local_28);
  bVar1 = sv("ftc",3);
  local_40 = bVar1._M_len;
  local_38 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_40,local_38);
  bVar1 = sv("forcetc",7);
  local_50 = bVar1._M_len;
  local_48 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_50,local_48);
  bVar1 = sv("teamchange",10);
  local_60 = bVar1._M_len;
  local_58 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_60,local_58);
  IRCCommand::setAccessLevel((int)this);
  return;
}

Assistant:

void TeamChangeIRCCommand::create() {
	this->addTrigger("team"sv);
	this->addTrigger("tc"sv);
	this->addTrigger("ftc"sv);
	this->addTrigger("forcetc"sv);
	this->addTrigger("teamchange"sv);
	this->setAccessLevel(3);
}